

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O2

void duckdb::CountFunction::CountScatter
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,Vector *states,
               idx_t count)

{
  STATE **states_00;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_a8;
  UnifiedVectorFormat local_60;
  
  if (states->vector_type == FLAT_VECTOR && inputs->vector_type == FLAT_VECTOR) {
    states_00 = (STATE **)states->data;
    FlatVector::VerifyFlatVector(inputs);
    CountFlatLoop(states_00,&inputs->validity,count);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_60);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_a8);
  Vector::ToUnifiedFormat(inputs,count,&local_60);
  Vector::ToUnifiedFormat(states,count,&local_a8);
  CountScatterLoop((STATE **)local_a8.data,local_60.sel,local_a8.sel,&local_60.validity,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_a8);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_60);
  return;
}

Assistant:

static void CountScatter(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, Vector &states,
	                         idx_t count) {
		auto &input = inputs[0];
		if (input.GetVectorType() == VectorType::FLAT_VECTOR && states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto sdata = FlatVector::GetData<STATE *>(states);
			CountFlatLoop(sdata, FlatVector::Validity(input), count);
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			CountScatterLoop(reinterpret_cast<STATE **>(sdata.data), *idata.sel, *sdata.sel, idata.validity, count);
		}
	}